

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

QString * __thiscall
QDBusXmlToCpp::propertyGetter
          (QString *__return_storage_ptr__,QDBusXmlToCpp *this,Property *property)

{
  long lVar1;
  QChar QVar2;
  QChar *pQVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  Annotation local_110;
  QArrayDataPointer<char16_t> local_d0;
  Annotation local_b8;
  Annotation annotation;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  annotation.value.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  annotation.value.d.size = -0x5555555555555556;
  annotation.name.d.size = -0x5555555555555556;
  annotation.value.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  annotation.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  annotation.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  annotation.location.lineNumber = -0x5555555555555556;
  annotation.location.columnNumber = -0x5555555555555556;
  latin1.m_data = "org.qtproject.QtDBus.PropertyGetter";
  latin1.m_size = 0x23;
  QString::QString((QString *)&local_110,latin1);
  local_b8.location.lineNumber = 1;
  local_b8.location.columnNumber = 0;
  local_b8.name.d.d = (Data *)0x0;
  local_b8.name.d.ptr = (char16_t *)0x0;
  local_b8.name.d.size = 0;
  local_b8.value.d.d = (Data *)0x0;
  local_b8.value.d.ptr = (char16_t *)0x0;
  local_b8.value.d.size = 0;
  QMap<QString,_QDBusIntrospection::Annotation>::value
            (&annotation,&property->annotations,(QString *)&local_110,&local_b8);
  QDBusIntrospection::Annotation::~Annotation(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_110);
  if (annotation.value.d.size == 0) {
    latin1_00.m_data = "com.trolltech.QtDBus.propertyGetter";
    latin1_00.m_size = 0x23;
    QString::QString((QString *)&local_d0,latin1_00);
    local_110.location.lineNumber = 1;
    local_110.location.columnNumber = 0;
    local_110.name.d.d = (Data *)0x0;
    local_110.name.d.ptr = (char16_t *)0x0;
    local_110.name.d.size = 0;
    local_110.value.d.d = (Data *)0x0;
    local_110.value.d.ptr = (char16_t *)0x0;
    local_110.value.d.size = 0;
    QMap<QString,_QDBusIntrospection::Annotation>::value
              (&local_b8,&property->annotations,(QString *)&local_d0,&local_110);
    QDBusIntrospection::Annotation::operator=(&annotation,&local_b8);
    QDBusIntrospection::Annotation::~Annotation(&local_b8);
    QDBusIntrospection::Annotation::~Annotation(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    if (annotation.value.d.size == 0) {
      (__return_storage_ptr__->d).size = -0x5555555555555556;
      (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(property->name).d)
      ;
      pQVar3 = QString::data(__return_storage_ptr__);
      QVar2 = QChar::toLower(pQVar3);
      pQVar3 = QString::data(__return_storage_ptr__);
      pQVar3->ucs = QVar2.ucs;
    }
    else {
      DiagnosticsReporter::warning
                (&this->reporter,&annotation.location,
                 "deprecated annotation \'com.trolltech.QtDBus.propertyGetter\' found\n");
      DiagnosticsReporter::note
                (&this->reporter,&annotation.location,
                 "suggest updating to \'org.qtproject.QtDBus.PropertyGetter\'\n");
      (__return_storage_ptr__->d).d = annotation.value.d.d;
      (__return_storage_ptr__->d).ptr = annotation.value.d.ptr;
      (__return_storage_ptr__->d).size = annotation.value.d.size;
      if (annotation.value.d.d != (Data *)0x0) {
        LOCK();
        ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
    }
  }
  else {
    (__return_storage_ptr__->d).d = annotation.value.d.d;
    (__return_storage_ptr__->d).ptr = annotation.value.d.ptr;
    (__return_storage_ptr__->d).size = annotation.value.d.size;
    if (annotation.value.d.d != (Data *)0x0) {
      LOCK();
      ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
  }
  QDBusIntrospection::Annotation::~Annotation(&annotation);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusXmlToCpp::propertyGetter(const QDBusIntrospection::Property &property)
{
    auto annotation = property.annotations.value("org.qtproject.QtDBus.PropertyGetter"_L1);
    if (!annotation.value.isEmpty())
        return annotation.value;

    annotation = property.annotations.value("com.trolltech.QtDBus.propertyGetter"_L1);
    if (!annotation.value.isEmpty()) {
        reporter.warning(annotation.location,
                         "deprecated annotation 'com.trolltech.QtDBus.propertyGetter' found\n");
        reporter.note(annotation.location,
                      "suggest updating to 'org.qtproject.QtDBus.PropertyGetter'\n");
        return annotation.value;
    }

    QString getter = property.name;
    getter[0] = getter[0].toLower();
    return getter;
}